

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::ThreadCleanUpTest::iterate(ThreadCleanUpTest *this)

{
  TestContext *this_00;
  bool bVar1;
  Library *egl;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  Exception *pEVar3;
  char *description;
  char *local_238;
  MessageBuilder local_230;
  undefined1 local_a0 [8];
  Thread thread;
  Maybe<eglu::Error> error;
  ThreadCleanUpTest *this_local;
  
  if (this->m_iterNdx < this->m_iterCount) {
    tcu::Maybe<eglu::Error>::Maybe((Maybe<eglu::Error> *)&thread.m_error);
    egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    Thread::Thread((Thread *)local_a0,egl,this->m_display,this->m_surface,this->m_context,
                   this->m_config,(Maybe<eglu::Error> *)&thread.m_error);
    de::Thread::start((Thread *)local_a0);
    de::Thread::join((Thread *)local_a0);
    bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&thread.m_error);
    if (bVar1) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_230,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_230,(char (*) [20])"Failed. Got error: ");
      pEVar3 = (Exception *)
               tcu::Maybe<eglu::Error>::operator->((Maybe<eglu::Error> *)&thread.m_error);
      local_238 = tcu::Exception::getMessage(pEVar3);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_238);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_230);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pEVar3 = (Exception *)
               tcu::Maybe<eglu::Error>::operator->((Maybe<eglu::Error> *)&thread.m_error);
      description = tcu::Exception::getMessage(pEVar3);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,description);
    }
    else {
      this->m_iterNdx = this->m_iterNdx + 1;
    }
    this_local._4_4_ = (IterateResult)!bVar1;
    Thread::~Thread((Thread *)local_a0);
    tcu::Maybe<eglu::Error>::~Maybe((Maybe<eglu::Error> *)&thread.m_error);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

IterateResult iterate (void)
	{
		if (m_iterNdx < m_iterCount)
		{
			tcu::Maybe<eglu::Error> error;

			Thread thread (m_eglTestCtx.getLibrary(), m_display, m_surface, m_context, m_config, error);

			thread.start();
			thread.join();

			if (error)
			{
				m_testCtx.getLog() << TestLog::Message << "Failed. Got error: " << error->getMessage() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, error->getMessage());
				return STOP;
			}

			m_iterNdx++;
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}